

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

void __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::set_bitset_table
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,range_pairs *fcc)

{
  uchar21 uVar1;
  range_pair *prVar2;
  uchar21 local_2c;
  uchar21 ucp;
  range_pair *range;
  size_type i;
  range_pairs *fcc_local;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  range = (range_pair *)0x0;
  do {
    prVar2 = (range_pair *)range_pairs::size(fcc);
    if (prVar2 <= range) {
      return;
    }
    prVar2 = range_pairs::operator[](fcc,(size_type)range);
    for (local_2c = prVar2->first; (uint)local_2c < 0x110000; local_2c = local_2c + L'\x01') {
      uVar1 = utf8_traits<char>::firstcodeunit(local_2c);
      bitset<256UL>::set(&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).
                          firstchar_class_bs,(ulong)(uint)(uVar1 & 0xff));
      if (local_2c == prVar2->second) break;
    }
    range = (range_pair *)((long)&range->first + 1);
  } while( true );
}

Assistant:

void set_bitset_table(const range_pairs &fcc)
	{
		for (typename range_pairs::size_type i = 0; i < fcc.size(); ++i)
		{
			const range_pair &range = fcc[i];

			for (uchar21 ucp = range.first; ucp <= constants::unicode_max_codepoint; ++ucp)
			{
				this->firstchar_class_bs.set(utf_traits::firstcodeunit(ucp) & utf_traits::bitsetmask);

				if (ucp == range.second)
					break;
			}
		}
	}